

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_options.h
# Opt level: O1

void BamTools::Options::AddValueOption<unsigned_int,unsigned_int_const>
               (string *argument,string *valueDescription,string *optionDescription,
               string *valueTypeDescription,bool *foundArgument,uint *val,OptionGroup *group,
               uint *defaultValue)

{
  size_t *psVar1;
  uint uVar2;
  ImplBase *pIVar3;
  mapped_type *pmVar4;
  OptionValue ov;
  undefined1 local_e8 [32];
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined2 local_88;
  Variant local_80;
  bool *local_78;
  uint *puStack_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  undefined2 local_48;
  bool local_46;
  Variant local_40 [2];
  
  local_e8._0_8_ = local_e8 + 0x10;
  local_e8._8_8_ = 0;
  local_e8[0x10] = '\0';
  local_c8._M_p = (pointer)&local_b8;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_a8._M_p = (pointer)&local_98;
  local_a0 = 0;
  local_98._M_local_buf[0] = '\0';
  local_88._0_1_ = true;
  local_88._1_1_ = false;
  local_80.data = (ImplBase *)0x0;
  std::__cxx11::string::_M_assign((string *)local_e8);
  std::__cxx11::string::_M_assign((string *)&local_c8);
  std::__cxx11::string::_M_assign((string *)&local_a8);
  uVar2 = *defaultValue;
  pIVar3 = (ImplBase *)operator_new(0x18);
  pIVar3->_vptr_ImplBase = (_func_int **)&PTR__ImplBase_001f2f68;
  *(uint *)&pIVar3[1]._vptr_ImplBase = uVar2;
  pIVar3->refs = 2;
  if (local_80.data != (ImplBase *)0x0) {
    psVar1 = &(local_80.data)->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*(local_80.data)->_vptr_ImplBase[1])();
    }
  }
  psVar1 = &pIVar3->refs;
  *psVar1 = *psVar1 - 1;
  local_80.data = pIVar3;
  if (*psVar1 == 0) {
    (*pIVar3->_vptr_ImplBase[1])(pIVar3);
  }
  local_88._1_1_ = true;
  std::vector<BamTools::Option,_std::allocator<BamTools::Option>_>::push_back
            (&group->Options,(value_type *)local_e8);
  local_60 = 0;
  local_58[0] = 0;
  local_48 = 0x100;
  local_46 = false;
  local_40[0].data = (ImplBase *)0x0;
  uVar2 = *val;
  local_78 = foundArgument;
  puStack_70 = val;
  local_68 = local_58;
  local_40[0].data = (ImplBase *)operator_new(0x18);
  (local_40[0].data)->_vptr_ImplBase = (_func_int **)&PTR__ImplBase_001f2f68;
  *(uint *)&local_40[0].data[1]._vptr_ImplBase = uVar2;
  (local_40[0].data)->refs = 2;
  (local_40[0].data)->refs = 1;
  local_46 = valueTypeDescription->_M_string_length != 0;
  std::__cxx11::string::_M_assign((string *)&local_68);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue>_>_>
           ::operator[](&m_optionsMap_abi_cxx11_,argument);
  pmVar4->pFoundArgument = local_78;
  pmVar4->pValue = puStack_70;
  std::__cxx11::string::_M_assign((string *)&pmVar4->ValueTypeDescription);
  pmVar4->IsRequired = local_46;
  pmVar4->UseVector = (bool)(undefined1)local_48;
  pmVar4->StoreValue = (bool)local_48._1_1_;
  Variant::operator=(&pmVar4->VariantValue,local_40);
  if (local_40[0].data != (ImplBase *)0x0) {
    psVar1 = &(local_40[0].data)->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*(local_40[0].data)->_vptr_ImplBase[1])();
    }
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if (local_80.data != (ImplBase *)0x0) {
    psVar1 = &(local_80.data)->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*(local_80.data)->_vptr_ImplBase[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p);
  }
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_);
  }
  return;
}

Assistant:

void Options::AddValueOption(const std::string& argument, const std::string& valueDescription,
                             const std::string& optionDescription,
                             const std::string& valueTypeDescription, bool& foundArgument, T& val,
                             OptionGroup* group, D& defaultValue)
{
    Option o;
    o.Argument = argument;
    o.ValueDescription = valueDescription;
    o.Description = optionDescription;
    o.DefaultValue = defaultValue;
    o.HasDefaultValue = true;
    group->Options.push_back(o);

    OptionValue ov;
    ov.pFoundArgument = &foundArgument;
    ov.pValue = (void*)&val;
    ov.VariantValue = val;
    ov.IsRequired = (valueTypeDescription.empty() ? false : true);
    ov.ValueTypeDescription = valueTypeDescription;
    m_optionsMap[argument] = ov;
}